

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

CheckerInstanceSymbol *
slang::ast::CheckerInstanceSymbol::createInvalid(CheckerSymbol *checker,uint32_t depth)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  undefined4 uVar3;
  size_t sVar4;
  ulong uVar5;
  SyntaxNode *pSVar6;
  SyntaxNode *pSVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  int iVar10;
  AssertionInstanceDetails *args_2;
  ulong pos0;
  CheckerInstanceSymbol *pCVar11;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  uint uVar12;
  Compilation *pCVar13;
  long lVar14;
  ulong uVar15;
  ulong hash;
  ulong uVar16;
  pointer ppAVar17;
  Scope *pSVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  LookupLocation LVar24;
  try_emplace_args_t local_1c1;
  CheckerInstanceBodySymbol *local_1c0;
  SyntaxNode *local_1b8;
  Compilation *local_1b0;
  Symbol *actualArg;
  CheckerSymbol *local_1a0;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
  *local_198;
  pointer local_190;
  ExpressionSyntax *outputInitialSyntax;
  uint32_t depth_local;
  undefined1 local_178 [16];
  bitmask<slang::ast::ASTFlags> local_168;
  Symbol *pSStack_160;
  TempVarSymbol *local_158;
  RandomizeDetails *pRStack_150;
  AssertionInstanceDetails *local_148;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_140;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  undefined1 local_128 [24];
  Symbol *pSStack_110;
  undefined1 local_108 [16];
  AssertionInstanceDetails *local_f8;
  locator res;
  SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> connections;
  
  pSVar18 = (checker->super_Symbol).parentScope;
  pCVar13 = pSVar18->compilation;
  depth_local = depth;
  args_2 = Compilation::allocAssertionDetails(pCVar13);
  args_2->symbol = &checker->super_Symbol;
  args_2->instanceLoc = (checker->super_Symbol).location;
  LVar24 = LookupLocation::after(&checker->super_Symbol);
  local_128._8_4_ = LVar24.index;
  stack0xfffffffffffffee8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (AssertionInstanceDetails *)0x0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)((ulong)connections.
                        super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ &
                0xffffffffffffff00);
  local_178[0] = 1;
  local_128._0_8_ = pSVar18;
  local_1c0 = BumpAllocator::
              emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext&,unsigned_int&,bool,slang::ast::InstanceFlags>
                        (&pCVar13->super_BumpAllocator,pCVar13,checker,args_2,
                         (ASTContext *)local_128,&depth_local,(bool *)&connections,local_178);
  local_1b8 = (checker->super_Symbol).originatingSyntax;
  (local_1c0->super_Symbol).originatingSyntax = local_1b8;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.
                firstElement;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.len = 0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.cap = 2;
  sVar4 = (checker->ports)._M_extent._M_extent_value;
  local_1b0 = pCVar13;
  local_1a0 = checker;
  if (sVar4 != 0) {
    ppAVar17 = (checker->ports)._M_ptr;
    local_190 = ppAVar17 + sVar4;
    local_198 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                 *)&args_2->argumentMap;
    do {
      if (((*ppAVar17)->super_Symbol).name._M_len != 0) {
        outputInitialSyntax = (ExpressionSyntax *)0x0;
        actualArg = createCheckerFormal(pCVar13,*ppAVar17,local_1c0,&outputInitialSyntax,
                                        (ASTContext *)local_128);
        local_148 = local_f8;
        local_178._12_4_ = local_128._12_4_;
        local_178._8_4_ = local_128._8_4_;
        local_158 = (TempVarSymbol *)local_108._0_8_;
        pRStack_150 = (RandomizeDetails *)local_108._8_8_;
        local_168.m_bits = local_128._16_8_;
        pSStack_160 = pSStack_110;
        local_178._0_8_ = local_128._0_8_;
        local_140._M_head_impl = (PropertyExprSyntax *)0x0;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = actualArg;
        hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        pos0 = hash >> ((byte)(args_2->argumentMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                              .arrays.groups_size_index & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar16 = 0;
        uVar15 = pos0;
        do {
          pgVar1 = (args_2->argumentMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.groups_ + uVar15;
          local_138 = pgVar1->m[0].n;
          uStack_137 = pgVar1->m[1].n;
          uStack_136 = pgVar1->m[2].n;
          bStack_135 = pgVar1->m[3].n;
          uStack_134 = pgVar1->m[4].n;
          uStack_133 = pgVar1->m[5].n;
          uStack_132 = pgVar1->m[6].n;
          bStack_131 = pgVar1->m[7].n;
          uStack_130 = pgVar1->m[8].n;
          uStack_12f = pgVar1->m[9].n;
          uStack_12e = pgVar1->m[10].n;
          bStack_12d = pgVar1->m[0xb].n;
          uStack_12c = pgVar1->m[0xc].n;
          uStack_12b = pgVar1->m[0xd].n;
          uStack_12a = pgVar1->m[0xe].n;
          bStack_129 = pgVar1->m[0xf].n;
          uVar19 = (uchar)uVar3;
          auVar23[0] = -(local_138 == uVar19);
          uVar20 = (uchar)((uint)uVar3 >> 8);
          auVar23[1] = -(uStack_137 == uVar20);
          uVar21 = (uchar)((uint)uVar3 >> 0x10);
          auVar23[2] = -(uStack_136 == uVar21);
          bVar22 = (byte)((uint)uVar3 >> 0x18);
          auVar23[3] = -(bStack_135 == bVar22);
          auVar23[4] = -(uStack_134 == uVar19);
          auVar23[5] = -(uStack_133 == uVar20);
          auVar23[6] = -(uStack_132 == uVar21);
          auVar23[7] = -(bStack_131 == bVar22);
          auVar23[8] = -(uStack_130 == uVar19);
          auVar23[9] = -(uStack_12f == uVar20);
          auVar23[10] = -(uStack_12e == uVar21);
          auVar23[0xb] = -(bStack_12d == bVar22);
          auVar23[0xc] = -(uStack_12c == uVar19);
          auVar23[0xd] = -(uStack_12b == uVar20);
          auVar23[0xe] = -(uStack_12a == uVar21);
          auVar23[0xf] = -(bStack_129 == bVar22);
          uVar12 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
          if (uVar12 != 0) {
            do {
              uVar8 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              pCVar13 = local_1b0;
              if (actualArg ==
                  (args_2->argumentMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .arrays.elements_[uVar15 * 0xf + (ulong)uVar8].first) goto LAB_001eaf5f;
              uVar12 = uVar12 - 1 & uVar12;
            } while (uVar12 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_129) == 0) break;
          uVar5 = (args_2->argumentMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .arrays.groups_size_mask;
          lVar14 = uVar15 + uVar16;
          uVar16 = uVar16 + 1;
          uVar15 = lVar14 + 1U & uVar5;
        } while (uVar16 <= uVar5);
        if ((args_2->argumentMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.size <
            (args_2->argumentMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    (&res,local_198,(arrays_type *)local_198,pos0,hash,&local_1c1,&actualArg,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     local_178);
          psVar2 = &(args_2->argumentMap).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                    .size_ctrl.size;
          *psVar2 = *psVar2 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    (&res,local_198,hash,&local_1c1,&actualArg,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     local_178);
        }
LAB_001eaf5f:
        local_178._0_8_ = (pointer)0x0;
        local_178._8_8_ = 0;
        SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
        emplace_back<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                  (&connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>
                   ,local_1c0,actualArg,&outputInitialSyntax,
                   (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
                   local_178);
      }
      ppAVar17 = ppAVar17 + 1;
    } while (ppAVar17 != local_190);
  }
  pSVar6 = local_1b8[7].previewNode;
  if (pSVar6 != (SyntaxNode *)0x0) {
    pSVar7 = local_1b8[7].parent;
    pSVar18 = &local_1c0->super_Scope;
    lVar14 = 0;
    do {
      Scope::addMembers(pSVar18,*(SyntaxNode **)((long)&pSVar7->kind + lVar14));
      lVar14 = lVar14 + 8;
    } while ((long)pSVar6 << 3 != lVar14);
  }
  pCVar13 = local_1b0;
  pCVar11 = BumpAllocator::
            emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::CheckerInstanceBodySymbol&>
                      (&local_1b0->super_BumpAllocator,&(local_1a0->super_Symbol).name,
                       &(local_1a0->super_Symbol).location,local_1c0);
  (pCVar11->super_InstanceSymbolBase).super_Symbol.originatingSyntax = local_1b8;
  iVar10 = SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::copy
                     (&connections.
                       super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>,
                      (EVP_PKEY_CTX *)pCVar13,src);
  (pCVar11->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar10);
  (pCVar11->connections)._M_extent._M_extent_value = extraout_RDX;
  if (connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ !=
      (pointer)connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.
               firstElement) {
    operator_delete(connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>
                    .data_);
  }
  return pCVar11;
}

Assistant:

CheckerInstanceSymbol& CheckerInstanceSymbol::createInvalid(const CheckerSymbol& checker,
                                                            uint32_t depth) {
    auto scope = checker.getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto assertionDetails = comp.allocAssertionDetails();
    assertionDetails->symbol = &checker;
    assertionDetails->instanceLoc = checker.location;

    ASTContext context(*scope, LookupLocation::after(checker));
    auto body = comp.emplace<CheckerInstanceBodySymbol>(comp, checker, *assertionDetails, context,
                                                        depth,
                                                        /* isProcedural */ false,
                                                        InstanceFlags::Uninstantiated);

    auto checkerSyntax = checker.getSyntax();
    SLANG_ASSERT(checkerSyntax);
    body->setSyntax(*checkerSyntax);

    SmallVector<Connection> connections;
    for (auto port : checker.ports) {
        if (port->name.empty())
            continue;

        const ExpressionSyntax* outputInitialSyntax = nullptr;
        auto actualArg = createCheckerFormal(comp, *port, *body, outputInitialSyntax, context);

        assertionDetails->argumentMap.emplace(
            actualArg, std::make_tuple((const PropertyExprSyntax*)nullptr, context));
        connections.emplace_back(*body, *actualArg, outputInitialSyntax,
                                 std::span<const AttributeSymbol* const>{});
    }

    for (auto member : checkerSyntax->as<CheckerDeclarationSyntax>().members)
        body->addMembers(*member);

    auto instance = comp.emplace<CheckerInstanceSymbol>(checker.name, checker.location, *body);
    instance->setSyntax(*checkerSyntax);
    instance->connections = connections.copy(comp);
    return *instance;
}